

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttf.c
# Opt level: O1

int ttf_font_descent(ALLEGRO_FONT *f)

{
  return (int)((ulong)-*(long *)(*(long *)(*f->data + 0xa0) + 0x38) >> 6);
}

Assistant:

static int ttf_font_descent(ALLEGRO_FONT const *f)
{
    ALLEGRO_TTF_FONT_DATA *data;
    FT_Face face;

    ASSERT(f);

    data = f->data;
    face = data->face;

    return (-face->size->metrics.descender) >> 6;
}